

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int addToSavepointBitvecs(Pager *pPager,Pgno pgno)

{
  uint uVar1;
  uint in_ESI;
  Bitvec *in_RDI;
  PagerSavepoint *p;
  int rc;
  int ii;
  uint local_14;
  int local_10;
  
  local_14 = 0;
  for (local_10 = 0; local_10 < (int)(in_RDI->u).aHash[0x1c]; local_10 = local_10 + 1) {
    if (in_ESI <= *(uint *)((long)&(in_RDI->u).apSub[0xd]->u + (long)local_10 * 0x38 + 8)) {
      uVar1 = sqlite3BitvecSet(in_RDI,in_ESI);
      local_14 = uVar1 | local_14;
    }
  }
  return local_14;
}

Assistant:

static int addToSavepointBitvecs(Pager *pPager, Pgno pgno){
  int ii;                   /* Loop counter */
  int rc = SQLITE_OK;       /* Result code */

  for(ii=0; ii<pPager->nSavepoint; ii++){
    PagerSavepoint *p = &pPager->aSavepoint[ii];
    if( pgno<=p->nOrig ){
      rc |= sqlite3BitvecSet(p->pInSavepoint, pgno);
      testcase( rc==SQLITE_NOMEM );
      assert( rc==SQLITE_OK || rc==SQLITE_NOMEM );
    }
  }
  return rc;
}